

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O0

error_code __thiscall
SL::WS_LITE::TLSContext::use_tmp_dh
          (TLSContext *this,uchar *buffer,size_t buffer_size,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  error_code eVar4;
  error_code eVar5;
  const_buffer local_78;
  int local_68;
  undefined4 uStack_64;
  error_category *local_60;
  __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_58;
  shared_ptr<SL::WS_LITE::ThreadContext> *a;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
  *__range2;
  error_code *ec_local;
  size_t buffer_size_local;
  uchar *buffer_local;
  TLSContext *this_local;
  error_code e;
  
  std::error_code::error_code((error_code *)&this_local);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->HubContext_);
  __end2 = std::
           vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ::begin(&peVar2->ThreadContexts);
  a = (shared_ptr<SL::WS_LITE::ThreadContext> *)
      std::
      vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
      ::end(&peVar2->ThreadContexts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                                *)&a);
    if (!bVar1) break;
    local_58 = (__shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                  ::operator*(&__end2);
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_58);
    asio::const_buffer::const_buffer(&local_78,buffer,buffer_size);
    eVar4 = asio::ssl::context::use_tmp_dh(&peVar3->context,&local_78,ec);
    local_60 = eVar4._M_cat;
    local_68 = eVar4._M_value;
    this_local = (TLSContext *)CONCAT44(uStack_64,local_68);
    e._0_8_ = local_60;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
    ::operator++(&__end2);
  }
  eVar5._0_8_ = (ulong)this_local & 0xffffffff;
  eVar5._M_cat = (error_category *)e._0_8_;
  return eVar5;
}

Assistant:

virtual std::error_code use_tmp_dh(const unsigned char *buffer, size_t buffer_size, std::error_code &ec) override
        {
            std::error_code e;
            for (auto &a : HubContext_->ThreadContexts) {
                e = a->context.use_tmp_dh(asio::const_buffer(buffer, buffer_size), ec);
            }
            return e;
        }